

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec-ops.c
# Opt level: O0

axbStatus_t
test(axbVec_s *x0,axbVec_s *x1,axbVec_s *x2,axbVec_s *x3,axbScalar_s *alpha,axbScalar_s *beta,
    axbScalar_s *gamma,double *y0,double *y1,double *y2,double *y3,double a,double b,double c)

{
  axbScalar_s *alpha_00;
  axbStatus_t aVar1;
  double dVar2;
  double a_00;
  double local_248;
  ulong local_238;
  size_t i_21;
  ulong uStack_228;
  int err_check_12388123_27;
  size_t i_20;
  ulong uStack_218;
  int err_check_12388123_26;
  size_t i_19;
  axbScalar_s *paStack_208;
  int err_check_12388123_25;
  axbScalar_s *scalars [3];
  axbVec_s *local_1e8;
  axbVec_s *vecs [3];
  ulong local_1c8;
  size_t i_18;
  ulong uStack_1b8;
  int err_check_12388123_24;
  size_t i_17;
  ulong uStack_1a8;
  int err_check_12388123_23;
  size_t i_16;
  ulong uStack_198;
  int err_check_12388123_22;
  size_t i_15;
  int err_check_12388123_21;
  int err_check_12388123_20;
  int err_check_12388123_19;
  int err_check_12388123_18;
  size_t i_14;
  ulong uStack_170;
  int err_check_12388123_17;
  size_t i_13;
  int err_check_12388123_16;
  int err_check_12388123_15;
  size_t i_12;
  int err_check_12388123_14;
  int err_check_12388123_13;
  size_t i_11;
  size_t idx1;
  size_t sStack_138;
  int err_check_12388123_12;
  size_t idx0;
  size_t i_10;
  ulong uStack_120;
  int err_check_12388123_11;
  size_t i_9;
  ulong uStack_110;
  int err_check_12388123_10;
  size_t i_8;
  ulong uStack_100;
  int err_check_12388123_9;
  size_t i_7;
  ulong uStack_f0;
  int err_check_12388123_8;
  size_t i_6;
  ulong uStack_e0;
  int err_check_12388123_7;
  size_t i_5;
  ulong uStack_d0;
  int err_check_12388123_6;
  size_t i_4;
  ulong uStack_c0;
  int err_check_12388123_5;
  size_t i_3;
  ulong uStack_b0;
  int err_check_12388123_4;
  size_t i_2;
  ulong uStack_a0;
  int err_check_12388123_3;
  size_t i_1;
  ulong uStack_90;
  int err_check_12388123_2;
  size_t i;
  double dStack_80;
  int err_check_12388123_1;
  double s;
  double t;
  double *temp;
  ulong uStack_60;
  int err_check_12388123;
  size_t n;
  double c_local;
  double b_local;
  double a_local;
  axbScalar_s *beta_local;
  axbScalar_s *alpha_local;
  axbVec_s *x3_local;
  axbVec_s *x2_local;
  axbVec_s *x1_local;
  axbVec_s *x0_local;
  
  n = (size_t)c;
  c_local = b;
  b_local = a;
  a_local = (double)beta;
  beta_local = alpha;
  alpha_local = (axbScalar_s *)x3;
  x3_local = x2;
  x2_local = x1;
  x1_local = x0;
  temp._4_4_ = axbVecGetSize(x1,&stack0xffffffffffffffa0);
  if (temp._4_4_ == 0) {
    t = (double)malloc(uStack_60 << 3);
    s = 0.0;
    dStack_80 = 0.0;
    i._4_4_ = axbVecSet(x1_local,beta_local);
    if (i._4_4_ == 0) {
      for (uStack_90 = 0; uStack_90 < uStack_60; uStack_90 = uStack_90 + 1) {
        y0[uStack_90] = b_local;
      }
      check_equal(x1_local,y0,(double *)t,"axbVecSet");
      i_1._4_4_ = axbVecSqrtAbs(x1_local);
      if (i_1._4_4_ == 0) {
        i_1._4_4_ = 0;
        for (uStack_a0 = 0; uStack_a0 < uStack_60; uStack_a0 = uStack_a0 + 1) {
          dVar2 = sqrt(ABS(y0[uStack_a0]));
          y0[uStack_a0] = dVar2;
        }
        check_equal(x1_local,y0,(double *)t,"axbVecSqrtAbs");
        i_2._4_4_ = axbVecZero(x1_local);
        if (i_2._4_4_ == 0) {
          for (uStack_b0 = 0; uStack_b0 < uStack_60; uStack_b0 = uStack_b0 + 1) {
            y0[uStack_b0] = 0.0;
          }
          check_equal(x1_local,y0,(double *)t,"axbVecZero");
          i_3._4_4_ = axbVecScale(x2_local,beta_local);
          if (i_3._4_4_ == 0) {
            for (uStack_c0 = 0; uStack_c0 < uStack_60; uStack_c0 = uStack_c0 + 1) {
              y1[uStack_c0] = b_local * y1[uStack_c0];
            }
            check_equal(x2_local,y1,(double *)t,"axbVecScale");
            i_4._4_4_ = axbVecSum(x2_local,beta_local);
            if (i_4._4_4_ == 0) {
              s = 0.0;
              for (uStack_d0 = 0; uStack_d0 < uStack_60; uStack_d0 = uStack_d0 + 1) {
                s = y1[uStack_d0] + s;
              }
              check_equal_scalar(beta_local,s,"axbVecSum");
              i_5._4_4_ = axbVecDot(x2_local,x3_local,beta_local);
              if (i_5._4_4_ == 0) {
                s = 0.0;
                for (uStack_e0 = 0; uStack_e0 < uStack_60; uStack_e0 = uStack_e0 + 1) {
                  s = y1[uStack_e0] * y2[uStack_e0] + s;
                }
                check_equal_scalar(beta_local,s,"axbVecDot");
                i_6._4_4_ = axbVecTDot(x2_local,x3_local,beta_local);
                if (i_6._4_4_ == 0) {
                  s = 0.0;
                  for (uStack_f0 = 0; uStack_f0 < uStack_60; uStack_f0 = uStack_f0 + 1) {
                    s = y1[uStack_f0] * y2[uStack_f0] + s;
                  }
                  check_equal_scalar(beta_local,s,"axbVecTDot");
                  i_7._4_4_ = axbVecNorm1(x2_local,beta_local);
                  if (i_7._4_4_ == 0) {
                    s = 0.0;
                    for (uStack_100 = 0; uStack_100 < uStack_60; uStack_100 = uStack_100 + 1) {
                      s = ABS(y1[uStack_100]) + s;
                    }
                    check_equal_scalar(beta_local,s,"axbVecNorm1");
                    i_8._4_4_ = axbVecNorm2(x2_local,beta_local);
                    alpha_00 = beta_local;
                    if (i_8._4_4_ == 0) {
                      s = 0.0;
                      for (uStack_110 = 0; uStack_110 < uStack_60; uStack_110 = uStack_110 + 1) {
                        s = y1[uStack_110] * y1[uStack_110] + s;
                      }
                      dVar2 = sqrt(s);
                      check_equal_scalar(alpha_00,dVar2,"axbVecNorm2");
                      i_9._4_4_ = axbVecNormInf(x2_local,beta_local);
                      if (i_9._4_4_ == 0) {
                        s = 0.0;
                        for (uStack_120 = 0; uStack_120 < uStack_60; uStack_120 = uStack_120 + 1) {
                          if (ABS(y1[uStack_120]) <= s) {
                            local_248 = s;
                          }
                          else {
                            local_248 = ABS(y1[uStack_120]);
                          }
                          s = local_248;
                        }
                        check_equal_scalar(beta_local,s,"axbVecNormInf");
                        i_10._4_4_ = axbVecDotNorm2(x2_local,x3_local,beta_local,
                                                    (axbScalar_s *)a_local);
                        if (i_10._4_4_ == 0) {
                          s = 0.0;
                          dStack_80 = 0.0;
                          for (idx0 = 0; idx0 < uStack_60; idx0 = idx0 + 1) {
                            dStack_80 = y1[idx0] * y2[idx0] + dStack_80;
                            s = y2[idx0] * y2[idx0] + s;
                          }
                          check_equal_scalar(beta_local,dStack_80,"axbVecDotNorm2, alpha");
                          dVar2 = a_local;
                          a_00 = sqrt(s);
                          check_equal_scalar((axbScalar_s *)dVar2,a_00,"axbVecDotNorm2, beta");
                          sStack_138 = 0;
                          aVar1 = axbVecMax(x2_local,&stack0xfffffffffffffec8,beta_local);
                          if (aVar1 == 0) {
                            s = *y1;
                            i_11 = 0;
                            for (_err_check_12388123_14 = 1; _err_check_12388123_14 < uStack_60;
                                _err_check_12388123_14 = _err_check_12388123_14 + 1) {
                              if (s < y1[_err_check_12388123_14]) {
                                i_11 = _err_check_12388123_14;
                                s = y1[_err_check_12388123_14];
                              }
                            }
                            aVar1 = axbScalarGetValue(beta_local,&stack0xffffffffffffff80,
                                                      AXB_REAL_DOUBLE);
                            if (aVar1 == 0) {
                              if (sStack_138 != i_11) {
                                fprintf(_stderr,
                                        "ERROR: index mismatch for axbVecMax: %ld (%g) vs. %ld (%g)\n"
                                        ,dStack_80,SUB84(s,0),sStack_138,i_11);
                                exit(1);
                              }
                              check_equal_scalar(beta_local,s,"axbVecMax");
                              sStack_138 = 0;
                              aVar1 = axbVecMin(x2_local,&stack0xfffffffffffffec8,beta_local);
                              if (aVar1 == 0) {
                                s = *y1;
                                i_11 = 0;
                                for (_err_check_12388123_16 = 1; _err_check_12388123_16 < uStack_60;
                                    _err_check_12388123_16 = _err_check_12388123_16 + 1) {
                                  if (y1[_err_check_12388123_16] < s) {
                                    i_11 = _err_check_12388123_16;
                                    s = y1[_err_check_12388123_16];
                                  }
                                }
                                aVar1 = axbScalarGetValue(beta_local,&stack0xffffffffffffff80,
                                                          AXB_REAL_DOUBLE);
                                if (aVar1 == 0) {
                                  if (sStack_138 != i_11) {
                                    fprintf(_stderr,
                                            "ERROR: index mismatch for axbVecMin: %ld (%g) vs. %ld (%g)\n"
                                            ,dStack_80,SUB84(s,0),sStack_138,i_11);
                                    exit(1);
                                  }
                                  check_equal_scalar(beta_local,s,"axbVecMin");
                                  aVar1 = axbVecCopy(x2_local,x1_local);
                                  if (aVar1 == 0) {
                                    for (uStack_170 = 0; uStack_170 < uStack_60;
                                        uStack_170 = uStack_170 + 1) {
                                      y0[uStack_170] = y1[uStack_170];
                                    }
                                    check_equal(x1_local,y0,(double *)t,"axbVecCopy, x0");
                                    check_equal(x2_local,y1,(double *)t,"axbVecCopy, x1");
                                    aVar1 = axbVecSwap(x1_local,x3_local);
                                    if (aVar1 == 0) {
                                      for (_err_check_12388123_19 = 0;
                                          _err_check_12388123_19 < uStack_60;
                                          _err_check_12388123_19 = _err_check_12388123_19 + 1) {
                                        s = y0[_err_check_12388123_19];
                                        y0[_err_check_12388123_19] = y2[_err_check_12388123_19];
                                        y2[_err_check_12388123_19] = s;
                                      }
                                      check_equal(x1_local,y0,(double *)t,"axbVecSwap, x0");
                                      check_equal(x3_local,y2,(double *)t,"axbVecSwap, x2");
                                      aVar1 = axbScalarGetValue(beta_local,&b_local,AXB_REAL_DOUBLE)
                                      ;
                                      if (aVar1 == 0) {
                                        aVar1 = axbScalarGetValue((axbScalar_s *)a_local,&c_local,
                                                                  AXB_REAL_DOUBLE);
                                        if (aVar1 == 0) {
                                          aVar1 = axbScalarGetValue(gamma,&n,AXB_REAL_DOUBLE);
                                          if (aVar1 == 0) {
                                            aVar1 = axbVecAXPY(x1_local,beta_local,x2_local);
                                            if (aVar1 == 0) {
                                              for (uStack_198 = 0; uStack_198 < uStack_60;
                                                  uStack_198 = uStack_198 + 1) {
                                                y0[uStack_198] =
                                                     b_local * y1[uStack_198] + y0[uStack_198];
                                              }
                                              check_equal(x1_local,y0,(double *)t,"axbVecAXPY");
                                              aVar1 = axbVecAYPX(x1_local,beta_local,x2_local);
                                              if (aVar1 == 0) {
                                                for (uStack_1a8 = 0; uStack_1a8 < uStack_60;
                                                    uStack_1a8 = uStack_1a8 + 1) {
                                                  y0[uStack_1a8] =
                                                       b_local * y0[uStack_1a8] + y1[uStack_1a8];
                                                }
                                                check_equal(x1_local,y0,(double *)t,"axbVecAYPX");
                                                aVar1 = axbVecAXPBYPCZ(x3_local,beta_local,
                                                                       (axbScalar_s *)a_local,gamma,
                                                                       x1_local,x2_local);
                                                if (aVar1 == 0) {
                                                  for (uStack_1b8 = 0; uStack_1b8 < uStack_60;
                                                      uStack_1b8 = uStack_1b8 + 1) {
                                                    y2[uStack_1b8] =
                                                         (double)n * y2[uStack_1b8] +
                                                         b_local * y0[uStack_1b8] +
                                                         c_local * y1[uStack_1b8];
                                                  }
                                                  check_equal(x3_local,y2,(double *)t,
                                                              "axbVecAXPBYPCZ");
                                                  aVar1 = axbVecWAXPY(x3_local,beta_local,x1_local,
                                                                      x2_local);
                                                  if (aVar1 == 0) {
                                                    for (local_1c8 = 0; local_1c8 < uStack_60;
                                                        local_1c8 = local_1c8 + 1) {
                                                      y2[local_1c8] =
                                                           b_local * y0[local_1c8] + y1[local_1c8];
                                                    }
                                                    check_equal(x3_local,y2,(double *)t,
                                                                "axbVecWAXPY");
                                                    local_1e8 = x2_local;
                                                    vecs[0] = x3_local;
                                                    vecs[1] = (axbVec_s *)alpha_local;
                                                    paStack_208 = beta_local;
                                                    scalars[0] = (axbScalar_s *)a_local;
                                                    scalars[1] = gamma;
                                                    aVar1 = axbVecMAXPY(x1_local,3,
                                                                        &stack0xfffffffffffffdf8,
                                                                        &local_1e8);
                                                    if (aVar1 == 0) {
                                                      for (uStack_218 = 0; uStack_218 < uStack_60;
                                                          uStack_218 = uStack_218 + 1) {
                                                        y0[uStack_218] =
                                                             (double)n * y3[uStack_218] +
                                                             b_local * y1[uStack_218] +
                                                             c_local * y2[uStack_218] +
                                                             y0[uStack_218];
                                                      }
                                                      check_equal(x1_local,y0,(double *)t,
                                                                  "axbVecMAXPY");
                                                      aVar1 = axbVecPointwiseMult(x1_local,x2_local,
                                                                                  x3_local);
                                                      if (aVar1 == 0) {
                                                        for (uStack_228 = 0; uStack_228 < uStack_60;
                                                            uStack_228 = uStack_228 + 1) {
                                                          y0[uStack_228] =
                                                               y1[uStack_228] * y2[uStack_228];
                                                        }
                                                        check_equal(x1_local,y0,(double *)t,
                                                                    "axbVecPointwiseMult");
                                                        aVar1 = axbVecPointwiseDivide
                                                                          (x1_local,x2_local,
                                                                           x3_local);
                                                        if (aVar1 == 0) {
                                                          for (local_238 = 0; local_238 < uStack_60;
                                                              local_238 = local_238 + 1) {
                                                            y0[local_238] =
                                                                 y1[local_238] / y2[local_238];
                                                          }
                                                          check_equal(x1_local,y0,(double *)t,
                                                                      "axbVecPointwiseDivide");
                                                          free((void *)t);
                                                          x0_local._4_4_ = 0;
                                                        }
                                                        else {
                                                          fprintf(_stderr,
                                                  "Failure in line %d in file %s\n",0xb4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                                                  );
                                                  x0_local._4_4_ = aVar1;
                                                  }
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "Failure in line %d in file %s\n",0xaf,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                                                  );
                                                  x0_local._4_4_ = aVar1;
                                                  }
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "Failure in line %d in file %s\n",0xaa,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                                                  );
                                                  x0_local._4_4_ = aVar1;
                                                  }
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "Failure in line %d in file %s\n",0xa3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                                                  );
                                                  x0_local._4_4_ = aVar1;
                                                  }
                                                }
                                                else {
                                                  fprintf(_stderr,"Failure in line %d in file %s\n",
                                                          0x9e,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                                                  );
                                                  x0_local._4_4_ = aVar1;
                                                }
                                              }
                                              else {
                                                fprintf(_stderr,"Failure in line %d in file %s\n",
                                                        0x99,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                                                  );
                                                x0_local._4_4_ = aVar1;
                                              }
                                            }
                                            else {
                                              fprintf(_stderr,"Failure in line %d in file %s\n",0x94
                                                      ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                                                  );
                                              x0_local._4_4_ = aVar1;
                                            }
                                          }
                                          else {
                                            fprintf(_stderr,"Failure in line %d in file %s\n",0x91,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                                                  );
                                            x0_local._4_4_ = aVar1;
                                          }
                                        }
                                        else {
                                          fprintf(_stderr,"Failure in line %d in file %s\n",0x90,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                                                 );
                                          x0_local._4_4_ = aVar1;
                                        }
                                      }
                                      else {
                                        fprintf(_stderr,"Failure in line %d in file %s\n",0x8f,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                                               );
                                        x0_local._4_4_ = aVar1;
                                      }
                                    }
                                    else {
                                      fprintf(_stderr,"Failure in line %d in file %s\n",0x8a,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                                             );
                                      x0_local._4_4_ = aVar1;
                                    }
                                  }
                                  else {
                                    fprintf(_stderr,"Failure in line %d in file %s\n",0x84,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                                           );
                                    x0_local._4_4_ = aVar1;
                                  }
                                }
                                else {
                                  fprintf(_stderr,"Failure in line %d in file %s\n",0x79,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                                         );
                                  x0_local._4_4_ = aVar1;
                                }
                              }
                              else {
                                fprintf(_stderr,"Failure in line %d in file %s\n",0x73,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                                       );
                                x0_local._4_4_ = aVar1;
                              }
                            }
                            else {
                              fprintf(_stderr,"Failure in line %d in file %s\n",0x6d,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                                     );
                              x0_local._4_4_ = aVar1;
                            }
                          }
                          else {
                            fprintf(_stderr,"Failure in line %d in file %s\n",0x67,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                                   );
                            x0_local._4_4_ = aVar1;
                          }
                        }
                        else {
                          fprintf(_stderr,"Failure in line %d in file %s\n",0x5e,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                                 );
                          x0_local._4_4_ = i_10._4_4_;
                        }
                      }
                      else {
                        fprintf(_stderr,"Failure in line %d in file %s\n",0x58,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                               );
                        x0_local._4_4_ = i_9._4_4_;
                      }
                    }
                    else {
                      fprintf(_stderr,"Failure in line %d in file %s\n",0x52,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                             );
                      x0_local._4_4_ = i_8._4_4_;
                    }
                  }
                  else {
                    fprintf(_stderr,"Failure in line %d in file %s\n",0x4c,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                           );
                    x0_local._4_4_ = i_7._4_4_;
                  }
                }
                else {
                  fprintf(_stderr,"Failure in line %d in file %s\n",0x43,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                         );
                  x0_local._4_4_ = i_6._4_4_;
                }
              }
              else {
                fprintf(_stderr,"Failure in line %d in file %s\n",0x3d,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                       );
                x0_local._4_4_ = i_5._4_4_;
              }
            }
            else {
              fprintf(_stderr,"Failure in line %d in file %s\n",0x36,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                     );
              x0_local._4_4_ = i_4._4_4_;
            }
          }
          else {
            fprintf(_stderr,"Failure in line %d in file %s\n",0x2b,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                   );
            x0_local._4_4_ = i_3._4_4_;
          }
        }
        else {
          fprintf(_stderr,"Failure in line %d in file %s\n",0x26,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                 );
          x0_local._4_4_ = i_2._4_4_;
        }
      }
      else {
        fprintf(_stderr,"Failure in line %d in file %s\n",0x21,
                "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
               );
        x0_local._4_4_ = i_1._4_4_;
      }
    }
    else {
      fprintf(_stderr,"Failure in line %d in file %s\n",0x1c,
              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
             );
      x0_local._4_4_ = i._4_4_;
    }
  }
  else {
    fprintf(_stderr,"Failure in line %d in file %s\n",0x10,
            "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
           );
    x0_local._4_4_ = temp._4_4_;
  }
  return x0_local._4_4_;
}

Assistant:

axbStatus_t test(struct axbVec_s *x0, struct axbVec_s *x1, struct axbVec_s *x2, struct axbVec_s *x3, struct axbScalar_s *alpha, struct axbScalar_s *beta, struct axbScalar_s *gamma,
                 double *y0, double *y1, double *y2, double *y3, double a, double b, double c)
{
  size_t n;
  AXB_ERR_CHECK(axbVecGetSize(x1, &n));
  double *temp = malloc(sizeof(double) * n);
  double t = 0;
  double s = 0;



  //
  // in-place operations
  //

  // AXB_OP_VEC_SET
  AXB_ERR_CHECK(axbVecSet(x0, alpha));
  for (size_t i=0; i<n; ++i) y0[i] = a;
  check_equal(x0, y0, temp, "axbVecSet");

  // AXB_OP_VEC_SQRTABS
  AXB_ERR_CHECK(axbVecSqrtAbs(x0));
  for (size_t i=0; i<n; ++i) y0[i] = sqrt(fabs(y0[i]));
  check_equal(x0, y0, temp, "axbVecSqrtAbs");

  // AXB_OP_VEC_ZERO
  AXB_ERR_CHECK(axbVecZero(x0));
  for (size_t i=0; i<n; ++i) y0[i] = 0;
  check_equal(x0, y0, temp, "axbVecZero");

  // AXB_OP_VEC_SCALE
  AXB_ERR_CHECK(axbVecScale(x1, alpha));
  for (size_t i=0; i<n; ++i) y1[i] *= a;
  check_equal(x1, y1, temp, "axbVecScale");



  //
  // reduction operations
  //

  //AXB_OP_VEC_SUM
  AXB_ERR_CHECK(axbVecSum(x1, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += y1[i];
  check_equal_scalar(alpha, t, "axbVecSum");


  //AXB_OP_VEC_DOT
  AXB_ERR_CHECK(axbVecDot(x1, x2, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += y1[i] * y2[i];
  check_equal_scalar(alpha, t, "axbVecDot");

  //AXB_OP_VEC_TDOT
  AXB_ERR_CHECK(axbVecTDot(x1, x2, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += y1[i] * y2[i];
  check_equal_scalar(alpha, t, "axbVecTDot");

  //AXB_OP_VEC_MDOT
  // skipping: tested separately

  //AXB_OP_VEC_NORM1
  AXB_ERR_CHECK(axbVecNorm1(x1, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += fabs(y1[i]);
  check_equal_scalar(alpha, t, "axbVecNorm1");

  //AXB_OP_VEC_NORM2
  AXB_ERR_CHECK(axbVecNorm2(x1, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += y1[i] * y1[i];
  check_equal_scalar(alpha, sqrt(t), "axbVecNorm2");

  //AXB_OP_VEC_NORMINF
  AXB_ERR_CHECK(axbVecNormInf(x1, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t = fabs(y1[i]) > t ? fabs(y1[i]) : t;
  check_equal_scalar(alpha, t, "axbVecNormInf");

  //AXB_OP_VEC_DOTNORM2
  AXB_ERR_CHECK(axbVecDotNorm2(x1, x2, alpha, beta));
  t=0;
  s=0;
  for (size_t i=0; i<n; ++i) { s += y1[i] * y2[i]; t += y2[i] * y2[i]; }
  check_equal_scalar(alpha, s, "axbVecDotNorm2, alpha");
  check_equal_scalar(beta, sqrt(t), "axbVecDotNorm2, beta");

  //AXB_OP_VEC_MAX
  size_t idx0 = 0;
  AXB_ERR_CHECK(axbVecMax(x1, &idx0, alpha));
  t=y1[0];
  size_t idx1 = 0;
  for (size_t i=1; i<n; ++i) {
    if (y1[i] > t) { idx1 = i; t = y1[i]; }
  }
  AXB_ERR_CHECK(axbScalarGetValue(alpha, &s, AXB_REAL_DOUBLE));
  if (idx0 != idx1) { fprintf(stderr, "ERROR: index mismatch for axbVecMax: %ld (%g) vs. %ld (%g)\n", idx0, s, idx1, t); exit(EXIT_FAILURE); }
  check_equal_scalar(alpha, t, "axbVecMax");

  //AXB_OP_VEC_MIN
  idx0 = 0;
  AXB_ERR_CHECK(axbVecMin(x1, &idx0, alpha));
  t=y1[0];
  idx1 = 0;
  for (size_t i=1; i<n; ++i) {
    if (y1[i] < t) { idx1 = i; t = y1[i]; }
  }
  AXB_ERR_CHECK(axbScalarGetValue(alpha, &s, AXB_REAL_DOUBLE));
  if (idx0 != idx1) { fprintf(stderr, "ERROR: index mismatch for axbVecMin: %ld (%g) vs. %ld (%g)\n", idx0, s, idx1, t); exit(EXIT_FAILURE); }
  check_equal_scalar(alpha, t, "axbVecMin");



  //
  // vector-vector operations
  //

  //AXB_OP_VEC_COPY
  AXB_ERR_CHECK(axbVecCopy(x1, x0));
  for (size_t i=0; i<n; ++i) y0[i] = y1[i];
  check_equal(x0, y0, temp, "axbVecCopy, x0");
  check_equal(x1, y1, temp, "axbVecCopy, x1");

  //AXB_OP_VEC_SWAP
  AXB_ERR_CHECK(axbVecSwap(x0, x2));
  for (size_t i=0; i<n; ++i) { t = y0[i]; y0[i] = y2[i]; y2[i] = t; }
  check_equal(x0, y0, temp, "axbVecSwap, x0");
  check_equal(x2, y2, temp, "axbVecSwap, x2");

  AXB_ERR_CHECK(axbScalarGetValue(alpha, &a, AXB_REAL_DOUBLE));  // reset
  AXB_ERR_CHECK(axbScalarGetValue(beta,  &b, AXB_REAL_DOUBLE));  // reset
  AXB_ERR_CHECK(axbScalarGetValue(gamma, &c, AXB_REAL_DOUBLE));  // reset

  //AXB_OP_VEC_AXPY
  AXB_ERR_CHECK(axbVecAXPY(x0, alpha, x1));
  for (size_t i=0; i<n; ++i) y0[i] += a * y1[i];
  check_equal(x0, y0, temp, "axbVecAXPY");

  //AXB_OP_VEC_AYPX
  AXB_ERR_CHECK(axbVecAYPX(x0, alpha, x1));
  for (size_t i=0; i<n; ++i) y0[i] = a * y0[i] + y1[i];
  check_equal(x0, y0, temp, "axbVecAYPX");

  //AXB_OP_VEC_AXPBYPCZ
  AXB_ERR_CHECK(axbVecAXPBYPCZ(x2, alpha, beta, gamma, x0, x1));
  for (size_t i=0; i<n; ++i) y2[i] = a * y0[i] + b * y1[i] + c * y2[i];
  check_equal(x2, y2, temp, "axbVecAXPBYPCZ");

  //AXB_OP_VEC_WAXPY
  AXB_ERR_CHECK(axbVecWAXPY(x2, alpha, x0, x1));
  for (size_t i=0; i<n; ++i) y2[i] = a * y0[i] + y1[i];
  check_equal(x2, y2, temp, "axbVecWAXPY");

  //AXB_OP_VEC_MAXPY
  struct axbVec_s *vecs[3] = {x1, x2, x3};
  struct axbScalar_s *scalars[3] = {alpha, beta, gamma};
  AXB_ERR_CHECK(axbVecMAXPY(x0, 3, (const struct axbScalar_s * const*)scalars, (const struct axbVec_s * const*)vecs));
  for (size_t i=0; i<n; ++i) y0[i] += a * y1[i] + b * y2[i] + c * y3[i];
  check_equal(x0, y0, temp, "axbVecMAXPY");

  //AXB_OP_VEC_POINTWISEMULT
  AXB_ERR_CHECK(axbVecPointwiseMult(x0, x1, x2));
  for (size_t i=0; i<n; ++i) y0[i] = y1[i] * y2[i];
  check_equal(x0, y0, temp, "axbVecPointwiseMult");

  //AXB_OP_VEC_POINTWISEDIV
  AXB_ERR_CHECK(axbVecPointwiseDivide(x0, x1, x2));
  for (size_t i=0; i<n; ++i) y0[i] = y1[i] / y2[i];
  check_equal(x0, y0, temp, "axbVecPointwiseDivide");

  free(temp);
  return 0;
}